

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableBeginRow(ImGuiTable *table)

{
  int *piVar1;
  float *pfVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  ImGuiWindow *pIVar6;
  ImGuiTable *pIVar7;
  ImU32 IVar8;
  ImU32 IVar9;
  float fVar10;
  
  pIVar6 = table->InnerWindow;
  piVar1 = &table->CurrentRow;
  *piVar1 = *piVar1 + 1;
  iVar3 = *piVar1;
  table->CurrentColumn = -1;
  table->RowBgColor[0] = 0x1000000;
  table->RowBgColor[1] = 0x1000000;
  table->RowCellDataCurrent = -1;
  table->IsInsideRow = true;
  fVar10 = table->RowPosY2;
  if ((iVar3 == 0) && (0 < table->FreezeRowsCount)) {
    fVar10 = (table->OuterRect).Min.y;
    (pIVar6->DC).CursorPos.y = fVar10;
  }
  table->RowPosY2 = fVar10;
  table->RowPosY1 = fVar10;
  table->RowTextBaseline = 0.0;
  table->RowIndentOffsetX = (pIVar6->DC).Indent.x - table->HostIndentX;
  (pIVar6->DC).PrevLineTextBaseOffset = 0.0;
  fVar4 = (pIVar6->DC).CursorPos.y;
  fVar5 = table->RowCellPaddingY;
  (pIVar6->DC).CursorPosPrevLine.x = (pIVar6->DC).CursorPos.x;
  (pIVar6->DC).CursorPosPrevLine.y = fVar4 + fVar5;
  (pIVar6->DC).IsSameLine = false;
  (pIVar6->DC).IsSetPos = false;
  (pIVar6->DC).CurrLineSize.x = 0.0;
  (pIVar6->DC).CurrLineSize.y = 0.0;
  (pIVar6->DC).PrevLineSize.x = 0.0;
  (pIVar6->DC).PrevLineSize.y = 0.0;
  (pIVar6->DC).CursorMaxPos.y = fVar10;
  if ((table->field_0x94 & 1) != 0) {
    IVar8 = GetColorU32(0x2c,1.0);
    pIVar7 = GImGui->CurrentTable;
    pfVar2 = &(pIVar7->InnerClipRect).Max.y;
    if (pIVar7->RowPosY1 < *pfVar2 || pIVar7->RowPosY1 == *pfVar2) {
      IVar9 = 0;
      if (IVar8 != 0x1000000) {
        IVar9 = IVar8;
      }
      pIVar7->RowBgColor[0] = IVar9;
    }
    if (table->CurrentRow == 0) {
      table->IsUsingHeaders = true;
    }
  }
  return;
}

Assistant:

void ImGui::TableBeginRow(ImGuiTable* table)
{
    ImGuiWindow* window = table->InnerWindow;
    IM_ASSERT(!table->IsInsideRow);

    // New row
    table->CurrentRow++;
    table->CurrentColumn = -1;
    table->RowBgColor[0] = table->RowBgColor[1] = IM_COL32_DISABLE;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;

    // Begin frozen rows
    float next_y1 = table->RowPosY2;
    if (table->CurrentRow == 0 && table->FreezeRowsCount > 0)
        next_y1 = window->DC.CursorPos.y = table->OuterRect.Min.y;

    table->RowPosY1 = table->RowPosY2 = next_y1;
    table->RowTextBaseline = 0.0f;
    table->RowIndentOffsetX = window->DC.Indent.x - table->HostIndentX; // Lock indent

    window->DC.PrevLineTextBaseOffset = 0.0f;
    window->DC.CursorPosPrevLine = ImVec2(window->DC.CursorPos.x, window->DC.CursorPos.y + table->RowCellPaddingY); // This allows users to call SameLine() to share LineSize between columns.
    window->DC.PrevLineSize = window->DC.CurrLineSize = ImVec2(0.0f, 0.0f); // This allows users to call SameLine() to share LineSize between columns, and to call it from first column too.
    window->DC.IsSameLine = window->DC.IsSetPos = false;
    window->DC.CursorMaxPos.y = next_y1;

    // Making the header BG color non-transparent will allow us to overlay it multiple times when handling smooth dragging.
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
    {
        TableSetBgColor(ImGuiTableBgTarget_RowBg0, GetColorU32(ImGuiCol_TableHeaderBg));
        if (table->CurrentRow == 0)
            table->IsUsingHeaders = true;
    }
}